

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteReleaseCursor(unqlite *pDb,unqlite_kv_cursor *pCur)

{
  unqlite_kv_methods *puVar1;
  unqlite_kv_methods *pMethods;
  unqlite_kv_cursor *pCur_local;
  unqlite *pDb_local;
  
  puVar1 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods;
  if (puVar1->xCursorRelease != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
    (*puVar1->xCursorRelease)(pCur);
  }
  SyMemBackendPoolFree(&pDb->sMem,pCur);
  return 0;
}

Assistant:

UNQLITE_PRIVATE int unqliteReleaseCursor(unqlite *pDb,unqlite_kv_cursor *pCur)
{
	unqlite_kv_methods *pMethods;
	/* Storage engine methods */
	pMethods = pDb->sDB.pPager->pEngine->pIo->pMethods;
	/* Invoke the release callback if available */
	if( pMethods->xCursorRelease ){
		pMethods->xCursorRelease(pCur);
	}
	/* Finally, free the whole instance */
	SyMemBackendPoolFree(&pDb->sMem,pCur);
	return UNQLITE_OK;
}